

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O1

QUEUE * __thiscall QUEUE::operator<<(QUEUE *this,int e)

{
  int iVar1;
  int iVar2;
  overflow_error *this_00;
  int tmp;
  int local_2c;
  
  iVar1 = (*(this->super_STACK)._vptr_STACK[9])();
  if (iVar1 != 1) {
    iVar1 = STACK::operator_cast_to_int(&this->super_STACK);
    iVar2 = (**(this->super_STACK)._vptr_STACK)(this);
    if (0 < iVar1 && iVar1 == iVar2) {
      do {
        STACK::operator>>(&this->super_STACK,&local_2c);
        STACK::operator<<(&this->s2,local_2c);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    STACK::operator<<(&this->super_STACK,e);
    return this;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"[ERROR] Queue overflowed!");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

QUEUE &QUEUE::operator << (int e) {
  if (full() == 1)
    throw std::overflow_error("[ERROR] Queue overflowed!");
	// If input stack is full
  int tmp;
  int input_length = this->STACK::operator int();
  if (input_length == this->size()) {
    for (int i = 0; i < input_length; i++) {
      this->STACK::operator>>(tmp);
      s2 << tmp;
    }
  }
  this->STACK::operator<<(e);
	return *this;
}